

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

shared_ptr<BER_CONTAINER> __thiscall IntegerCallback::buildTypeWithValue(IntegerCallback *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  SortableOIDType *pSVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined **in_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar5;
  
  piVar3 = *(int **)(in_RSI + 0x18);
  if (piVar3 == (int *)0x0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    pSVar4 = (SortableOIDType *)operator_new(0x28);
    (pSVar4->super_OIDType).super_BER_CONTAINER._type = 1;
    (pSVar4->super_OIDType).super_BER_CONTAINER._length = 1;
    (pSVar4->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0019fdc8;
    iVar1 = *piVar3;
    (pSVar4->super_OIDType)._value._M_dataplus._M_p = (pointer)0x2;
    in_RDX = &PTR__BER_CONTAINER_001a15f0;
    *(undefined ***)&(pSVar4->super_OIDType).valid = &PTR__BER_CONTAINER_001a15f0;
    *(int *)&(pSVar4->super_OIDType)._value._M_string_length = iVar1;
    iVar2 = *(int *)(in_RSI + 0x20);
    if (iVar2 != 0) {
      in_RDX = (undefined **)((long)iVar1 % (long)iVar2 & 0xffffffff);
      *(int *)&(pSVar4->super_OIDType)._value._M_string_length = iVar1 / iVar2;
    }
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&(pSVar4->super_OIDType).valid;
    (this->super_ValueCallback).OID = pSVar4;
  }
  sVar5.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  sVar5.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar5.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> IntegerCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    auto val = std::make_shared<IntegerType>(*this->value);
    if(this->modifier != 0){
        // Apple local division if callback was asked to
        val->_value /= this->modifier;
    }
    return val;
}